

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QRectF * __thiscall
QWidgetEffectSourcePrivate::boundingRect
          (QRectF *__return_storage_ptr__,QWidgetEffectSourcePrivate *this,CoordinateSystem system)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  QWidgetData *pQVar6;
  QRect *pQVar7;
  long in_FS_OFFSET;
  int iVar10;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  if (system == DeviceCoordinates) {
    if (this->context == (QWidgetPaintContext *)0x0) {
      boundingRect();
    }
    else {
      pQVar7 = (QRect *)QPainter::worldTransform();
      auVar9 = QTransform::mapRect(pQVar7);
      __return_storage_ptr__->xp = (double)auVar9._0_4_;
      __return_storage_ptr__->yp = (double)auVar9._4_4_;
      __return_storage_ptr__->w = (double)(((long)auVar9._8_4_ - (long)auVar9._0_4_) + 1);
      __return_storage_ptr__->h = (double)(((auVar9._8_8_ >> 0x20) - (auVar9._0_8_ >> 0x20)) + 1);
    }
  }
  else {
    pQVar6 = this->m_widget->data;
    __return_storage_ptr__->xp = 0.0;
    __return_storage_ptr__->yp = 0.0;
    uVar1 = (pQVar6->crect).x2;
    uVar3 = (pQVar6->crect).y2;
    uVar2 = (pQVar6->crect).x1;
    uVar4 = (pQVar6->crect).y1;
    iVar10 = uVar1 - uVar2;
    auVar8._4_4_ = uVar3 - uVar4;
    auVar8._8_4_ = auVar8._4_4_;
    auVar8._12_4_ = -(uint)(auVar8._4_4_ < 0);
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    __return_storage_ptr__->w = (double)(CONCAT44(-(uint)(iVar10 < 0),iVar10) + 1);
    __return_storage_ptr__->h = (double)(auVar8._8_8_ - auVar9._8_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QWidgetEffectSourcePrivate::boundingRect(Qt::CoordinateSystem system) const
{
    if (system != Qt::DeviceCoordinates)
        return m_widget->rect();

    if (Q_UNLIKELY(!context)) {
        // Device coordinates without context not yet supported.
        qWarning("QGraphicsEffectSource::boundingRect: Not yet implemented, lacking device context");
        return QRectF();
    }

    return context->painter->worldTransform().mapRect(m_widget->rect());
}